

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

unique_ptr<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
 __thiscall
bioparser::Parser<bioparser::test::PafOverlap>::Create<bioparser::PafParser>
          (Parser<bioparser::test::PafOverlap> *this,string *path)

{
  undefined8 uVar1;
  invalid_argument *this_00;
  pointer __p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  gzFile local_20;
  gzFile file;
  string *path_local;
  
  file = (gzFile)path;
  path_local = (string *)this;
  uVar1 = std::__cxx11::string::c_str();
  local_20 = (gzFile)gzopen(uVar1,"r");
  if (local_20 == (gzFile)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_40,"[bioparser::Parser::Create] error: unable to open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __p = (pointer)operator_new(0x58);
  PafParser<bioparser::test::PafOverlap>::PafParser
            ((PafParser<bioparser::test::PafOverlap> *)__p,local_20);
  std::
  unique_ptr<bioparser::Parser<bioparser::test::PafOverlap>,std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>>>
  ::unique_ptr<std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>>,void>
            ((unique_ptr<bioparser::Parser<bioparser::test::PafOverlap>,std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>>>
              *)this,__p);
  return (__uniq_ptr_data<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>,_true,_true>
          )(__uniq_ptr_data<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<Parser<T>> Create(const std::string& path) {
    auto file = gzopen(path.c_str(), "r");
    if (file == nullptr) {
      throw std::invalid_argument(
          "[bioparser::Parser::Create] error: unable to open file " + path);
    }
    return std::unique_ptr<Parser<T>>(new P<T>(file));
  }